

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int refine_cell(saucy *s,coloring *c,_func_int_saucy_ptr_coloring_ptr_int *refine)

{
  bool bVar1;
  int local_2c;
  int ret;
  int cf;
  int i;
  _func_int_saucy_ptr_coloring_ptr_int *refine_local;
  coloring *c_local;
  saucy *s_local;
  
  local_2c = 1;
  if (1 < s->lev) {
    introsort(s->clist,s->csize);
  }
  ret = 0;
  while( true ) {
    bVar1 = false;
    if (local_2c != 0) {
      bVar1 = ret < s->csize;
    }
    if (!bVar1) break;
    local_2c = (*refine)(s,c,s->clist[ret]);
    ret = ret + 1;
  }
  for (ret = 0; ret < s->csize; ret = ret + 1) {
    s->conncnts[s->clist[ret]] = 0;
  }
  s->csize = 0;
  return local_2c;
}

Assistant:

static int
refine_cell(struct saucy *s, struct coloring *c,
    int (*refine)(struct saucy *, struct coloring *, int))
{
    int i, cf, ret = 1;

    /*
     * The connected list must be consistent.  This is for
     * detecting mappings across nodes at a given level.  However,
     * at the root of the tree, we never have to map with another
     * node, so we lack this consistency constraint in that case.
     */
    if (s->lev > 1) introsort(s->clist, s->csize);

    /* Now iterate over the marked cells */
    for (i = 0; ret && i < s->csize; ++i) {
        cf = s->clist[i];
        ret = refine(s, c, cf);
    }

    /* Clear the connected marks */
    for (i = 0; i < s->csize; ++i) {
        cf = s->clist[i];
        s->conncnts[cf] = 0;
    }
    s->csize = 0;
    return ret;
}